

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 FindBestWindowPosForPopup(ImGuiWindow *window)

{
  float fVar1;
  uint uVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  float fVar6;
  float fVar7;
  ImVec2 ref_pos;
  ImRect r_avoid;
  ImRect r_outer;
  ImVec2 local_40;
  float local_34;
  ImRect local_30;
  ImRect local_20;
  
  pIVar5 = GImGui;
  local_20 = FindAllowedExtentRectForWindow(window);
  uVar2 = window->Flags;
  if ((uVar2 >> 0x1c & 1) == 0) {
    if ((uVar2 >> 0x1a & 1) == 0) {
      if ((uVar2 >> 0x19 & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x1552,"ImVec2 FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      local_34 = (pIVar5->Style).MouseCursorScale;
      local_40 = NavCalcPreferredRefPos();
      if (((pIVar5->NavDisableHighlight == false) && (pIVar5->NavDisableMouseHover == true)) &&
         (((pIVar5->IO).ConfigFlags & 4) == 0)) {
        local_30.Max.x = local_40.x + 16.0;
        fVar7 = 8.0;
      }
      else {
        fVar7 = local_34 * 24.0;
        local_30.Max.x = fVar7 + local_40.x;
      }
      local_30.Min.y = local_40.y + -8.0;
      local_30.Min.x = local_40.x + -16.0;
      local_30.Max.y = fVar7 + local_40.y;
      IVar4 = FindBestWindowPosForPopupEx
                        (&local_40,&window->Size,&window->AutoPosLastDirection,&local_20,&local_30,
                         ImGuiPopupPositionPolicy_Default);
      fVar7 = IVar4.x;
      fVar6 = IVar4.y;
      if (window->AutoPosLastDirection == -1) {
        fVar7 = local_40.x + 2.0;
        fVar6 = local_40.y + 2.0;
      }
      goto LAB_00185f30;
    }
    fVar7 = (window->Pos).x;
    fVar6 = (window->Pos).y;
    local_30.Min.y = fVar6 + -1.0;
    local_30.Min.x = fVar7 + -1.0;
    local_30.Max.y = fVar6 + 1.0;
    local_30.Max.x = fVar7 + 1.0;
  }
  else {
    if (pIVar5->CurrentWindow != window) {
      __assert_fail("g.CurrentWindow == window",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x1534,"ImVec2 FindBestWindowPosForPopup(ImGuiWindow *)");
    }
    pIVar3 = (pIVar5->CurrentWindowStack).Data[(long)(pIVar5->CurrentWindowStack).Size + -2];
    fVar7 = (pIVar5->Style).ItemSpacing.x;
    if ((pIVar3->DC).MenuBarAppending == true) {
      uVar2 = pIVar3->Flags;
      fVar7 = 0.0;
      fVar6 = 0.0;
      if ((uVar2 & 1) == 0) {
        fVar6 = (pIVar5->Style).FramePadding.y;
        fVar6 = fVar6 + fVar6 + pIVar5->FontBaseSize * pIVar3->FontWindowScale;
      }
      local_30.Min.y = (pIVar3->Pos).y;
      if ((uVar2 & 1) == 0) {
        fVar7 = (pIVar5->Style).FramePadding.y;
        fVar7 = fVar7 + fVar7 + pIVar5->FontBaseSize * pIVar3->FontWindowScale;
      }
      local_30.Max.y = 0.0;
      if ((uVar2 >> 10 & 1) != 0) {
        fVar1 = (pIVar5->Style).FramePadding.y;
        local_30.Max.y =
             fVar1 + fVar1 +
             pIVar5->FontBaseSize * pIVar3->FontWindowScale + (pIVar3->DC).MenuBarOffset.y;
      }
      local_30.Max.y = fVar7 + local_30.Min.y + local_30.Max.y;
      local_30.Min.y = local_30.Min.y + fVar6;
      local_30.Max.x = 3.4028235e+38;
      local_30.Min.x = -3.4028235e+38;
    }
    else {
      fVar6 = (pIVar3->Pos).x;
      local_30.Min.x = fVar7 + fVar6;
      local_30.Max.x = ((fVar6 + (pIVar3->Size).x) - fVar7) - (pIVar3->ScrollbarSizes).x;
      local_30.Max.y = 3.4028235e+38;
      local_30.Min.y = -3.4028235e+38;
    }
  }
  IVar4 = FindBestWindowPosForPopupEx
                    (&window->Pos,&window->Size,&window->AutoPosLastDirection,&local_20,&local_30,
                     ImGuiPopupPositionPolicy_Default);
  fVar7 = IVar4.x;
  fVar6 = IVar4.y;
LAB_00185f30:
  IVar4.y = fVar6;
  IVar4.x = fVar7;
  return IVar4;
}

Assistant:

static ImVec2 FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = FindAllowedExtentRectForWindow(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then our FindBestWindowPosForPopup() function will move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemSpacing.x;       // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight(), FLT_MAX, parent_window->Pos.y + parent_window->TitleBarHeight() + parent_window->MenuBarHeight());
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}